

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dig.c
# Opt level: O2

int use_pick_axe2(obj *obj,schar dx,schar dy,schar dz)

{
  char cVar1;
  monst *mtmp;
  level *plVar2;
  boolean bVar3;
  uint uVar4;
  trap *trap;
  obj *poVar5;
  xchar xVar6;
  int tmp;
  int iVar7;
  char *pcVar8;
  uint uVar9;
  int iVar10;
  char *pcVar11;
  uint x;
  bool bVar12;
  schar dy_local;
  schar dx_local;
  char *local_148;
  ulong local_140;
  char buf [256];
  
  if ((byte)(obj->oclass | 4U) == 6) {
    bVar12 = objects[obj->otyp].oc_subtyp != '\x04';
    pcVar8 = "digging";
    if (bVar12) {
      pcVar8 = "chopping";
    }
  }
  else {
    pcVar8 = "chopping";
    bVar12 = true;
  }
  dy_local = dy;
  dx_local = dx;
  if (((u._1052_1_ & 1) != 0) && (bVar3 = attack(u.ustuck,dx,dy), bVar3 != '\0')) {
    return 1;
  }
  if ((u._1052_1_ & 2) != 0) {
    pcVar11 = "Turbulence torpedoes your %s attempts.";
    goto LAB_00163c83;
  }
  if (dz < '\0') {
    if ((u.uprops[0x12].extrinsic != 0 || u.uprops[0x12].intrinsic != 0) ||
       ((youmonst.data)->mlet == '\x05')) {
      pcVar8 = "You don\'t have enough leverage.";
      goto LAB_00163c93;
    }
    pcVar8 = ceiling((int)u.ux,(int)u.uy);
  }
  else {
    if ((dx == '\0' && dz == '\0') && dy == '\0') {
      iVar7 = rnd(2);
      iVar10 = dbon();
      iVar7 = (int)obj->spe + iVar7 + iVar10;
      if (iVar7 < 2) {
        iVar7 = 1;
      }
      pcVar8 = yname(uwep);
      pline("You hit yourself with %s.",pcVar8);
      sprintf(buf,"%s own %s",genders[flags.female != '\0'].his,
              obj_descr[objects[obj->otyp].oc_name_idx].oc_name);
      losehp(iVar7,buf,1);
      iflags.botl = '\x01';
      return 1;
    }
    if (dz == '\0') {
      if ((((u.uprops[0x1b].intrinsic != 0) || (u.umonnum == 0x9e)) ||
          ((youmonst.data)->mlet == '\x1c')) ||
         ((u.uprops[0x1c].intrinsic != 0 && (uVar9 = mt_random(), uVar9 % 5 == 0)))) {
        confdir(&dx_local,&dy_local);
        dx = dx_local;
        dy = dy_local;
      }
      plVar2 = level;
      if ((0x4e < ((int)dx + (int)u.ux) - 1U) || (uVar9 = (int)u.uy + (int)dy, 0x14 < uVar9)) {
        pcVar8 = "Clash!";
        goto LAB_00163c93;
      }
      x = (int)u.ux + (int)dx;
      local_140 = (ulong)x;
      mtmp = level->monsters[local_140][uVar9];
      local_148 = pcVar8;
      if (((mtmp != (monst *)0x0) && ((mtmp->field_0x61 & 2) == 0)) &&
         (bVar3 = attack(mtmp,dx,dy), bVar3 != '\0')) {
        return 1;
      }
      uVar4 = dig_typ(obj,(xchar)x,(xchar)uVar9);
      if (uVar4 != 0) {
        did_dig_msg = 0;
        digging.quiet = '\0';
        if ((x == (int)digging.pos.x) && (uVar9 == (int)digging.pos.y)) {
          bVar3 = on_level(&digging.level,&u.uz);
          pcVar8 = local_148;
          if (digging.down == '\0' && bVar3 != '\0') {
            pcVar11 = "begin";
            if (digging.chew == '\0') {
              pcVar11 = "continue";
            }
            pline("You %s %s.",pcVar11,use_pick_axe2::d_action[uVar4]);
            digging._12_2_ = digging._12_2_ & 0xff;
            goto LAB_00163e7f;
          }
        }
        else {
        }
        pcVar8 = local_148;
        if (((uVar4 == 1) && (flags.autodig != '\0')) &&
           ((digging.down == '\0' &&
            (((digging.pos.x == u.ux && (digging.pos.y == u.uy)) &&
             ((uint)digging.lastdigtime <= moves && moves <= digging.lastdigtime + 2U)))))) {
          did_dig_msg = 1;
          digging.quiet = '\x01';
        }
        digging.down = '\0';
        digging.chew = '\0';
        digging.warned = '\0';
        digging.pos.x = (xchar)x;
        digging.pos.y = (xchar)uVar9;
        assign_level(&digging.level,&u.uz);
        digging.effort = 0;
        if (digging.quiet == '\0') {
          pline("You start %s.",use_pick_axe2::d_action[uVar4]);
        }
LAB_00163e7f:
        set_occupation(dig,pcVar8,0);
        return 1;
      }
      trap = t_at(level,x,uVar9);
      if ((trap != (trap *)0x0) && ((trap->field_0x8 & 0x1f) == 0x13)) {
        if ((trap->field_0x8 & 0x20) == 0) {
          seetrap(trap);
          pline("There is a spider web there!");
        }
        pcVar8 = aobjnam(obj,"become");
        pline("Your %s entangled in the web.",pcVar8);
        iVar7 = 2;
        for (iVar10 = -2; iVar10 != 0; iVar10 = iVar10 + 1) {
          uVar9 = mt_random();
          iVar7 = iVar7 + (uVar9 & 1);
        }
        nomul(-iVar7,"stuck in a spider web");
        nomovemsg = "You pull free.";
        return 1;
      }
      cVar1 = plVar2->locations[local_140][uVar9].typ;
      if (cVar1 != '\r') {
        if (cVar1 == '\x16') {
          pline("Clang!");
          wake_nearby();
          return 1;
        }
        if ((cVar1 != '\x0e') && ((cVar1 == '\0' & ((level->flags).field_0xa & 0x10) >> 4) == 0)) {
          if (cVar1 < '\x11') {
            pcVar8 = "You need a pick to dig rock.";
            goto LAB_00163c93;
          }
          if ((bVar12) &&
             ((poVar5 = sobj_at(0x215,level,x,uVar9), poVar5 != (obj *)0x0 ||
              (poVar5 = sobj_at(0x214,level,x,uVar9), poVar5 != (obj *)0x0)))) {
            uVar4 = mt_random();
            poVar5 = sobj_at(0x215,level,x,uVar9);
            pcVar8 = "statue";
            if (poVar5 == (obj *)0x0) {
              pcVar8 = "boulder";
            }
            pcVar11 = "";
            if (uVar4 % 3 == 0) {
              pcVar11 = " The axe-handle vibrates violently!";
            }
            pline("Sparks fly as you whack the %s.%s",pcVar8,pcVar11);
            if (uVar4 % 3 != 0) {
              return 1;
            }
            losehp(2,"axing a hard object",1);
            return 1;
          }
          goto LAB_001639db;
        }
      }
      pcVar8 = "You need an axe to cut down a tree.";
LAB_00163c93:
      pline(pcVar8);
      return 1;
    }
    bVar3 = on_level(&u.uz,&dungeon_topology.d_air_level);
    if ((bVar3 != '\0') || (bVar3 = on_level(&u.uz,&dungeon_topology.d_water_level), bVar3 != '\0'))
    {
LAB_001639db:
      pcVar8 = aobjnam(obj,(char *)0x0);
      pcVar11 = "You swing your %s through thin air.";
      goto LAB_00163c83;
    }
    bVar3 = can_reach_floor();
    if (bVar3 != '\0') {
      bVar3 = is_pool(level,(int)u.ux,(int)u.uy);
      if ((bVar3 == '\0') && (bVar3 = is_lava(level,(int)u.ux,(int)u.uy), bVar3 == '\0')) {
        if (bVar12) {
          pcVar8 = aobjnam(obj,(char *)0x0);
          pcVar11 = surface((int)u.ux,(int)u.uy);
          pline("Your %s merely scratches the %s.",pcVar8,pcVar11);
          u_wipe_engr(3);
          return 1;
        }
        xVar6 = u.ux;
        if ((((digging.pos.x == u.ux) && (xVar6 = digging.pos.x, digging.pos.y == u.uy)) &&
            (bVar3 = on_level(&digging.level,&u.uz), xVar6 = u.ux, bVar3 != '\0')) &&
           (digging.down != '\0')) {
          pline("You continue %s downward.",pcVar8);
        }
        else {
          digging.down = '\x01';
          digging.chew = '\0';
          digging.warned = '\0';
          digging.pos.x = xVar6;
          digging.pos.y = u.uy;
          assign_level(&digging.level,&u.uz);
          digging.effort = 0;
          pline("You start %s downward.",pcVar8);
          if (u.ushops[0] != '\0') {
            shopdig(0);
          }
        }
        did_dig_msg = 0;
        goto LAB_00163e7f;
      }
      bVar3 = is_pool(level,(int)u.ux,(int)u.uy);
      pcVar8 = "water";
      if (bVar3 == '\0') {
        pcVar8 = " the lava";
      }
      pcVar11 = "You cannot stay under%s long enough.";
      goto LAB_00163c83;
    }
    pcVar8 = surface((int)u.ux,(int)u.uy);
  }
  pcVar11 = "You can\'t reach the %s.";
LAB_00163c83:
  pline(pcVar11,pcVar8);
  return 1;
}

Assistant:

int use_pick_axe2(struct obj *obj, schar dx, schar dy, schar dz)
{
	int rx, ry;
	struct rm *loc;
	int dig_target;
	boolean ispick = is_pick(obj);
	const char *verbing = ispick ? "digging" : "chopping";

	if (u.uswallow && attack(u.ustuck, dx, dy)) {
		;  /* return 1 */
	} else if (Underwater) {
		pline("Turbulence torpedoes your %s attempts.", verbing);
	} else if (dz < 0) {
		if (Levitation)
			pline("You don't have enough leverage.");
		else
			pline("You can't reach the %s.",ceiling(u.ux,u.uy));
	} else if (!dx && !dy && !dz) {
		char buf[BUFSZ];
		int dam;

		dam = rnd(2) + dbon() + obj->spe;
		if (dam <= 0)
		    dam = 1;
		pline("You hit yourself with %s.", yname(uwep));
		sprintf(buf, "%s own %s", uhis(),
				OBJ_NAME(objects[obj->otyp]));
		losehp(dam, buf, KILLED_BY);
		iflags.botl=1;
		return 1;
	} else if (dz == 0) {
		if (Stunned || (Confusion && !rn2(5)))
		    confdir(&dx, &dy);
		rx = u.ux + dx;
		ry = u.uy + dy;
		if (!isok(rx, ry)) {
			pline("Clash!");
			return 1;
		}
		loc = &level->locations[rx][ry];
		if (MON_AT(level, rx, ry) && attack(m_at(level, rx, ry), dx, dy))
			return 1;
		dig_target = dig_typ(obj, rx, ry);
		if (dig_target == DIGTYP_UNDIGGABLE) {
			/* ACCESSIBLE or POOL */
			struct trap *trap = t_at(level, rx, ry);

			if (trap && trap->ttyp == WEB) {
			    if (!trap->tseen) {
				seetrap(trap);
				pline("There is a spider web there!");
			    }
			    pline("Your %s entangled in the web.",
				aobjnam(obj, "become"));
			    /* you ought to be able to let go; tough luck */
			    /* (maybe `move_into_trap()' would be better) */
			    nomul(-dice(2,2), "stuck in a spider web");
			    nomovemsg = "You pull free.";
			} else if (loc->typ == IRONBARS) {
			    pline("Clang!");
			    wake_nearby();
			} else if (IS_TREES(level, loc->typ))
			    pline("You need an axe to cut down a tree.");
			else if (IS_ROCK(loc->typ))
			    pline("You need a pick to dig rock.");
			else if (!ispick && (sobj_at(STATUE, level, rx, ry) ||
					     sobj_at(BOULDER, level, rx, ry))) {
			    boolean vibrate = !rn2(3);
			    pline("Sparks fly as you whack the %s.%s",
				sobj_at(STATUE, level, rx, ry) ? "statue" : "boulder",
				vibrate ? " The axe-handle vibrates violently!" : "");
			    if (vibrate) losehp(2, "axing a hard object", KILLED_BY);
			}
			else
			    pline("You swing your %s through thin air.",
				aobjnam(obj, NULL));
		} else {
			static const char * const d_action[6] = {
						"swinging",
						"digging",
						"chipping the statue",
						"hitting the boulder",
						"chopping at the door",
						"cutting the tree"
			};
			did_dig_msg = FALSE;
			digging.quiet = FALSE;
			if (digging.pos.x != rx || digging.pos.y != ry ||
			    !on_level(&digging.level, &u.uz) || digging.down) {
			    if (flags.autodig &&
				dig_target == DIGTYP_ROCK && !digging.down &&
				digging.pos.x == u.ux &&
				digging.pos.y == u.uy &&
				(moves <= digging.lastdigtime+2 &&
				 moves >= digging.lastdigtime)) {
				/* avoid messages if repeated autodigging */
				did_dig_msg = TRUE;
				digging.quiet = TRUE;
			    }
			    digging.down = digging.chew = FALSE;
			    digging.warned = FALSE;
			    digging.pos.x = rx;
			    digging.pos.y = ry;
			    assign_level(&digging.level, &u.uz);
			    digging.effort = 0;
			    if (!digging.quiet)
				pline("You start %s.", d_action[dig_target]);
			} else {
			    pline("You %s %s.", digging.chew ? "begin" : "continue",
					d_action[dig_target]);
			    digging.chew = FALSE;
			}
			set_occupation(dig, verbing, 0);
		}
	} else if (Is_airlevel(&u.uz) || Is_waterlevel(&u.uz)) {
		/* it must be air -- water checked above */
		pline("You swing your %s through thin air.", aobjnam(obj, NULL));
	} else if (!can_reach_floor()) {
		pline("You can't reach the %s.", surface(u.ux,u.uy));
	} else if (is_pool(level, u.ux, u.uy) || is_lava(level, u.ux, u.uy)) {
		/* Monsters which swim also happen not to be able to dig */
		pline("You cannot stay under%s long enough.",
				is_pool(level, u.ux, u.uy) ? "water" : " the lava");
	} else if (!ispick) {
		pline("Your %s merely scratches the %s.",
				aobjnam(obj, NULL), surface(u.ux,u.uy));
		u_wipe_engr(3);
	} else {
		if (digging.pos.x != u.ux || digging.pos.y != u.uy ||
			!on_level(&digging.level, &u.uz) || !digging.down) {
		    digging.chew = FALSE;
		    digging.down = TRUE;
		    digging.warned = FALSE;
		    digging.pos.x = u.ux;
		    digging.pos.y = u.uy;
		    assign_level(&digging.level, &u.uz);
		    digging.effort = 0;
		    pline("You start %s downward.", verbing);
		    if (*u.ushops) shopdig(0);
		} else
		    pline("You continue %s downward.", verbing);
		did_dig_msg = FALSE;
		set_occupation(dig, verbing, 0);
	}
	return 1;
}